

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::ClampScrollOffsetRecursive(Element *this)

{
  uint uVar1;
  ulong uVar3;
  int iVar2;
  
  ClampScrollOffset(this);
  iVar2 = (int)((ulong)((long)(this->children).
                              super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->children).
                             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar1 = iVar2 - this->num_non_dom_children;
  if (uVar1 != 0 && this->num_non_dom_children <= iVar2) {
    uVar3 = 0;
    do {
      ClampScrollOffsetRecursive
                ((Element *)
                 (this->children).
                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void Element::ClampScrollOffsetRecursive()
{
	ClampScrollOffset();
	const int num_children = GetNumChildren();
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->ClampScrollOffsetRecursive();
}